

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreply.cpp
# Opt level: O2

void __thiscall QNetworkReply::setAttribute(QNetworkReply *this,Attribute code,QVariant *value)

{
  QHash<QNetworkRequest::Attribute,QVariant> *this_00;
  long in_FS_OFFSET;
  Attribute local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHash<QNetworkRequest::Attribute,QVariant> *)(*(long *)&this->field_0x8 + 0x1b8);
  local_c = code;
  if (*(ulong *)&(value->d).field_0x18 < 4) {
    QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)this_00,&local_c);
  }
  else {
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>(this_00,&local_c,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReply::setAttribute(QNetworkRequest::Attribute code, const QVariant &value)
{
    Q_D(QNetworkReply);
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}